

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

void __thiscall
glslang::TSmallArrayVector::push_back(TSmallArrayVector *this,TSmallArrayVector *newDims)

{
  vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
  local_28;
  const_iterator local_20;
  TSmallArrayVector *local_18;
  TSmallArrayVector *newDims_local;
  TSmallArrayVector *this_local;
  
  local_18 = newDims;
  newDims_local = this;
  alloc(this);
  this_00 = (vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *)this->sizes;
  local_28._M_current =
       (TArraySize *)
       std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::end
                 (&this->sizes->
                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>)
  ;
  __gnu_cxx::
  __normal_iterator<glslang::TArraySize_const*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>
  ::__normal_iterator<glslang::TArraySize*>
            ((__normal_iterator<glslang::TArraySize_const*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>
              *)&local_20,&local_28);
  __first = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::begin
                      (&local_18->sizes->
                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                      );
  __last = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::end
                     (&local_18->sizes->
                       super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                     );
  std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>::
  insert<__gnu_cxx::__normal_iterator<glslang::TArraySize*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>,void>
            (this_00,local_20,
             (__normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
              )__first._M_current,
             (__normal_iterator<glslang::TArraySize_*,_std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>_>
              )__last._M_current);
  return;
}

Assistant:

void push_back(const TSmallArrayVector& newDims)
    {
        alloc();
        sizes->insert(sizes->end(), newDims.sizes->begin(), newDims.sizes->end());
    }